

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_buffer_isView(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue JVar1;
  byte bVar2;
  BOOL res;
  JSObject *p;
  JSValue *argv_local;
  int argc_local;
  JSContext *ctx_local;
  JSValue this_val_local;
  undefined4 uStack_c;
  
  bVar2 = 0;
  if ((((int)argv->tag == -1) && (0x14 < *(ushort *)((long)(argv->u).ptr + 6))) &&
     (*(ushort *)((long)(argv->u).ptr + 6) < 0x1f)) {
    bVar2 = 1;
  }
  JVar1.u.int32._1_3_ = 0;
  JVar1.u.int32._0_1_ = bVar2;
  JVar1.u._4_4_ = uStack_c;
  JVar1.tag = 1;
  return JVar1;
}

Assistant:

static JSValue js_array_buffer_isView(JSContext *ctx,
                                      JSValueConst this_val,
                                      int argc, JSValueConst *argv)
{
    JSObject *p;
    BOOL res;
    res = FALSE;
    if (JS_VALUE_GET_TAG(argv[0]) == JS_TAG_OBJECT) {
        p = JS_VALUE_GET_OBJ(argv[0]);
        if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
            p->class_id <= JS_CLASS_DATAVIEW) {
            res = TRUE;
        }
    }
    return JS_NewBool(ctx, res);
}